

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::transfernodes(tetgenmesh *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  tetgenio *ptVar5;
  double *pdVar6;
  tetgenbehavior *ptVar7;
  pointparam *ppVar8;
  undefined1 auVar9 [16];
  double *in_RAX;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  point pointloop;
  double *local_38;
  
  if (0 < this->in->numberofpoints) {
    lVar14 = 0;
    lVar13 = 0;
    iVar10 = 0;
    iVar12 = 0;
    local_38 = in_RAX;
    do {
      makepoint(this,&local_38,UNUSEDVERTEX);
      ptVar5 = this->in;
      pdVar6 = ptVar5->pointlist;
      dVar1 = pdVar6[lVar14];
      *local_38 = dVar1;
      dVar18 = pdVar6[lVar14 + 1];
      local_38[1] = dVar18;
      dVar19 = pdVar6[lVar14 + 2];
      local_38[2] = dVar19;
      iVar2 = ptVar5->numberofpointattributes;
      if (0 < (long)iVar2) {
        pdVar6 = ptVar5->pointattributelist;
        lVar11 = 0;
        do {
          local_38[lVar11 + 3] = pdVar6[iVar12 + lVar11];
          lVar11 = lVar11 + 1;
        } while (iVar2 != lVar11);
        iVar12 = iVar12 + (int)lVar11;
      }
      iVar3 = ptVar5->numberofpointmtrs;
      if (0 < (long)iVar3) {
        iVar4 = this->pointmtrindex;
        pdVar6 = ptVar5->pointmtrlist;
        lVar11 = 0;
        do {
          local_38[iVar4 + lVar11] = pdVar6[iVar10 + lVar11];
          lVar11 = lVar11 + 1;
        } while (iVar3 != lVar11);
        iVar10 = iVar10 + (int)lVar11;
      }
      ptVar7 = this->b;
      if (ptVar7->weighted != 0) {
        if (iVar2 < 1) {
          dVar21 = ABS(dVar18);
          if (ABS(dVar18) <= ABS(dVar1)) {
            dVar21 = ABS(dVar1);
          }
          if (dVar21 < ABS(dVar19)) {
            dVar21 = ABS(dVar19);
          }
        }
        else {
          dVar21 = local_38[3];
        }
        if (ptVar7->weighted_param == 0) {
          dVar21 = (dVar19 * dVar19 + dVar1 * dVar1 + dVar18 * dVar18) - dVar21;
        }
        local_38[3] = dVar21;
      }
      if (lVar13 == 0) {
        this->ymax = dVar18;
        this->ymin = dVar18;
        this->xmax = dVar1;
        this->xmin = dVar1;
        this->zmax = dVar19;
        this->zmin = dVar19;
      }
      else {
        uVar15 = -(ulong)(this->xmax < dVar1);
        uVar16 = -(ulong)(dVar1 < this->xmin);
        this->xmax = (double)(~uVar15 & (ulong)this->xmax | (ulong)dVar1 & uVar15);
        this->xmin = (double)(~uVar16 & (ulong)this->xmin | (ulong)dVar1 & uVar16);
        uVar15 = -(ulong)(this->ymax < dVar18);
        uVar16 = -(ulong)(dVar18 < this->ymin);
        this->ymax = (double)(~uVar15 & (ulong)this->ymax | (ulong)dVar18 & uVar15);
        this->ymin = (double)(~uVar16 & (ulong)this->ymin | (ulong)dVar18 & uVar16);
        uVar16 = -(ulong)(this->zmax < dVar19);
        uVar17 = -(ulong)(dVar19 < this->zmin);
        uVar15 = (ulong)dVar19 & uVar17;
        auVar20._0_8_ = ~uVar16 & (ulong)this->zmax;
        auVar20._8_8_ = ~uVar17 & (ulong)this->zmin;
        auVar9._8_4_ = (int)uVar15;
        auVar9._0_8_ = (ulong)dVar19 & uVar16;
        auVar9._12_4_ = (int)(uVar15 >> 0x20);
        this->zmax = (double)SUB168(auVar20 | auVar9,0);
        this->zmin = (double)SUB168(auVar20 | auVar9,8);
      }
      if (ptVar7->psc != 0) {
        ppVar8 = ptVar5->pointparamlist;
        iVar2 = this->pointparamindex;
        local_38[iVar2] = ppVar8[lVar13].uv[0];
        local_38[(long)iVar2 + 1] = ppVar8[lVar13].uv[1];
        *(int *)((long)local_38 + (long)this->pointmarkindex * 4 + 8) = ppVar8[lVar13].tag;
        if ((ulong)(uint)ppVar8[lVar13].type < 4) {
          *(uint *)((long)local_38 + (long)this->pointmarkindex * 4 + 4) =
               (uint)*(byte *)((long)local_38 + (long)this->pointmarkindex * 4 + 4) |
               *(uint *)(&DAT_0016c470 + (ulong)(uint)ppVar8[lVar13].type * 4);
        }
      }
      lVar14 = lVar14 + 3;
      lVar13 = lVar13 + 1;
    } while (lVar13 < ptVar5->numberofpoints);
  }
  dVar1 = this->xmax - this->xmin;
  dVar18 = this->ymax - this->ymin;
  dVar19 = this->zmax - this->zmin;
  dVar1 = SQRT(dVar19 * dVar19 + dVar1 * dVar1 + dVar18 * dVar18);
  this->longest = dVar1;
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    puts("Error:  The point set is trivial.");
    puts("An input error was detected. Program stopped.");
    exit(10);
  }
  this->minedgelength = dVar1 * this->b->epsilon;
  return;
}

Assistant:

void tetgenmesh::transfernodes()
{
  point pointloop;
  REAL x, y, z, w;
  int coordindex;
  int attribindex;
  int mtrindex;
  int i, j;

  // Read the points.
  coordindex = 0;
  attribindex = 0;
  mtrindex = 0;
  for (i = 0; i < in->numberofpoints; i++) {
    makepoint(&pointloop, UNUSEDVERTEX);
    // Read the point coordinates.
    x = pointloop[0] = in->pointlist[coordindex++];
    y = pointloop[1] = in->pointlist[coordindex++];
    z = pointloop[2] = in->pointlist[coordindex++];
    // Read the point attributes. (Including point weights.)
    for (j = 0; j < in->numberofpointattributes; j++) {
      pointloop[3 + j] = in->pointattributelist[attribindex++];
    }
    // Read the point metric tensor.
    for (j = 0; j < in->numberofpointmtrs; j++) {
      pointloop[pointmtrindex + j] = in->pointmtrlist[mtrindex++];
    }
    if (b->weighted) { // -w option
      if (in->numberofpointattributes > 0) {
        // The first point attribute is its weight.
        //w = in->pointattributelist[in->numberofpointattributes * i];
        w = pointloop[3];
      } else {
        // No given weight available. Default choose the maximum
        //   absolute value among its coordinates.        
        w = fabs(x);
        if (w < fabs(y)) w = fabs(y);
        if (w < fabs(z)) w = fabs(z);
      }
      if (b->weighted_param == 0) {
        pointloop[3] = x * x + y * y + z * z - w; // Weighted DT.
      } else { // -w1 option
        pointloop[3] = w;  // Regular tetrahedralization.
      }
    }
    // Determine the smallest and largest x, y and z coordinates.
    if (i == 0) {
      xmin = xmax = x;
      ymin = ymax = y;
      zmin = zmax = z;
    } else {
      xmin = (x < xmin) ? x : xmin;
      xmax = (x > xmax) ? x : xmax;
      ymin = (y < ymin) ? y : ymin;
      ymax = (y > ymax) ? y : ymax;
      zmin = (z < zmin) ? z : zmin;
      zmax = (z > zmax) ? z : zmax;
    }
    if (b->psc) {
      // Read the geometry parameters.
      setpointgeomuv(pointloop, 0, in->pointparamlist[i].uv[0]);
      setpointgeomuv(pointloop, 1, in->pointparamlist[i].uv[1]);
      setpointgeomtag(pointloop, in->pointparamlist[i].tag);
      if (in->pointparamlist[i].type == 0) {
        setpointtype(pointloop, RIDGEVERTEX);
      } else if (in->pointparamlist[i].type == 1) {
        setpointtype(pointloop, FREESEGVERTEX);
      } else if (in->pointparamlist[i].type == 2) {
        setpointtype(pointloop, FREEFACETVERTEX);
      } else if (in->pointparamlist[i].type == 3) {
        setpointtype(pointloop, FREEVOLVERTEX);
      }
    }
  }

  // 'longest' is the largest possible edge length formed by input vertices.
  x = xmax - xmin;
  y = ymax - ymin;
  z = zmax - zmin;
  longest = sqrt(x * x + y * y + z * z);
  if (longest == 0.0) {
    printf("Error:  The point set is trivial.\n");
    terminatetetgen(this, 10);
  }
  // Two identical points are distinguished by 'minedgelength'.
  minedgelength = longest * b->epsilon;
}